

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O1

int dwarf_close_str_offsets_table_access(Dwarf_Str_Offsets_Table table_data,Dwarf_Error *error)

{
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  
  if (table_data == (Dwarf_Str_Offsets_Table)0x0) {
    errval = 0x192;
  }
  else {
    dbg = table_data->so_dbg;
    if (dbg != (Dwarf_Debug)0x0) {
      if (table_data->so_magic_value == 0x2feed2) {
        table_data->so_magic_value = 0xdead;
        dwarf_dealloc(dbg,table_data,0x40);
        return 0;
      }
      errval = 0x194;
      goto LAB_001caf27;
    }
    errval = 0x193;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001caf27:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_close_str_offsets_table_access(
    Dwarf_Str_Offsets_Table  table_data,
    Dwarf_Error             * error)
{
    Dwarf_Debug dbg = 0;

    VALIDATE_SOT(table_data)
    dbg = table_data->so_dbg;
    table_data->so_magic_value = 0xdead;
    dwarf_dealloc(dbg,table_data, DW_DLA_STR_OFFSETS);
    return DW_DLV_OK;
}